

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O3

void Prs_ManInitializeNtk(Prs_Man_t *p,int iName,int fSlices)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  Hash_IntMan_t *pHVar4;
  Vec_Ptr_t *pVVar5;
  Prs_Ntk_t *pPVar6;
  Abc_Nam_t *pAVar7;
  void **ppvVar8;
  
  if (p->pNtk == (Prs_Ntk_t *)0x0) {
    pPVar6 = (Prs_Ntk_t *)calloc(1,0xf0);
    p->pNtk = pPVar6;
    pPVar6->iModuleName = iName;
    pPVar6->field_0x4 = 2;
    pAVar7 = Abc_NamRef(p->pStrs);
    p->pNtk->pStrs = pAVar7;
    pAVar7 = Abc_NamRef(p->pFuns);
    pPVar6 = p->pNtk;
    pPVar6->pFuns = pAVar7;
    pHVar4 = p->vHash;
    piVar1 = &pHVar4->nRefs;
    *piVar1 = *piVar1 + 1;
    pPVar6->vHash = pHVar4;
    pVVar5 = p->vNtks;
    uVar2 = pVVar5->nSize;
    if (uVar2 == pVVar5->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar5->pArray == (void **)0x0) {
          ppvVar8 = (void **)malloc(0x80);
        }
        else {
          ppvVar8 = (void **)realloc(pVVar5->pArray,0x80);
        }
        pVVar5->pArray = ppvVar8;
        pVVar5->nCap = 0x10;
      }
      else {
        if (pVVar5->pArray == (void **)0x0) {
          ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
        }
        else {
          ppvVar8 = (void **)realloc(pVVar5->pArray,(ulong)uVar2 << 4);
        }
        pVVar5->pArray = ppvVar8;
        pVVar5->nCap = uVar2 * 2;
      }
    }
    else {
      ppvVar8 = pVVar5->pArray;
    }
    iVar3 = pVVar5->nSize;
    pVVar5->nSize = iVar3 + 1;
    ppvVar8[iVar3] = pPVar6;
    return;
  }
  __assert_fail("p->pNtk == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaPrs.h"
                ,0xd7,"void Prs_ManInitializeNtk(Prs_Man_t *, int, int)");
}

Assistant:

static inline void Prs_ManInitializeNtk( Prs_Man_t * p, int iName, int fSlices )
{
    assert( p->pNtk == NULL );
    p->pNtk = ABC_CALLOC( Prs_Ntk_t, 1 );
    p->pNtk->iModuleName = iName;
    p->pNtk->fSlices = fSlices;
    p->pNtk->pStrs = Abc_NamRef( p->pStrs );
    p->pNtk->pFuns = Abc_NamRef( p->pFuns );
    p->pNtk->vHash = Hash_IntManRef( p->vHash );
    Vec_PtrPush( p->vNtks, p->pNtk );
}